

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_byte_array_stop_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_external_type cVar1;
  byte bVar2;
  cram_encoding cVar3;
  byte bVar7;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  byte *pbVar13;
  size_t sVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  char buf [20];
  byte local_48 [24];
  
  if (prefix == (char *)0x0) {
    iVar15 = 0;
  }
  else {
    sVar4 = strlen(prefix);
    puVar5 = b->data;
    uVar10 = b->alloc;
    sVar12 = b->byte;
    if (uVar10 <= sVar12 + sVar4) {
      do {
        auVar16._8_4_ = (int)(uVar10 >> 0x20);
        auVar16._0_8_ = uVar10;
        auVar16._12_4_ = 0x45300000;
        dVar18 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) * 1.5;
        uVar11 = (ulong)dVar18;
        sVar14 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
        if (uVar10 == 0) {
          sVar14 = 0x400;
        }
        b->alloc = sVar14;
        puVar5 = (uchar *)realloc(puVar5,sVar14);
        b->data = puVar5;
        uVar10 = b->alloc;
        sVar12 = b->byte;
      } while (uVar10 <= sVar12 + sVar4);
    }
    memcpy(puVar5 + sVar12,prefix,sVar4);
    b->byte = b->byte + sVar4;
    iVar15 = (int)sVar4;
  }
  cVar3 = c->codec;
  if (cVar3 < 0x80) {
    pbVar13 = local_48 + 1;
  }
  else {
    bVar2 = (byte)(cVar3 >> 8);
    if (cVar3 < 0x4000) {
      pbVar13 = local_48 + 2;
      local_48[0] = bVar2 | 0x80;
    }
    else {
      local_48[1] = (byte)(cVar3 >> 0x10);
      if (cVar3 < 0x200000) {
        pbVar13 = local_48 + 3;
        local_48[0] = local_48[1] | 0xc0;
        local_48[1] = bVar2;
      }
      else {
        local_48[0] = (byte)(cVar3 >> 0x18);
        if (cVar3 < 0x10000000) {
          pbVar13 = local_48 + 4;
          local_48[0] = local_48[0] | 0xe0;
          local_48[2] = bVar2;
        }
        else {
          pbVar13 = local_48 + 5;
          local_48[0] = local_48[0] >> 4 | 0xf0;
          local_48[1] = (byte)(cVar3 >> 0x14);
          local_48[2] = (byte)(cVar3 >> 0xc);
          local_48[3] = (byte)(cVar3 >> 4);
          cVar3 = (cram_encoding)((byte)cVar3 & 0xf);
        }
      }
    }
  }
  pbVar13[-1] = (byte)cVar3;
  if ((version & 0xffffff00U) == 0x100) {
    *pbVar13 = 5;
    pbVar13[1] = (c->field_6).byte_array_stop.stop;
    *(cram_external_type *)(pbVar13 + 2) = (c->field_6).external.type;
    pbVar13 = pbVar13 + 6;
  }
  else {
    cVar1 = (c->field_6).external.type;
    bVar2 = (byte)cVar1;
    if (cVar1 < 0x80) {
      *pbVar13 = 2;
      pbVar13[1] = (c->field_6).byte_array_stop.stop;
      pbVar13[2] = bVar2;
      lVar6 = 1;
    }
    else {
      bVar7 = (byte)(cVar1 >> 8);
      if (cVar1 < 0x4000) {
        *pbVar13 = 3;
        pbVar13[1] = (c->field_6).byte_array_stop.stop;
        pbVar13[2] = bVar7 | 0x80;
        pbVar13[3] = bVar2;
        lVar6 = 2;
      }
      else {
        bVar8 = (byte)(cVar1 >> 0x10);
        if (cVar1 < 0x200000) {
          *pbVar13 = 4;
          pbVar13[1] = (c->field_6).byte_array_stop.stop;
          pbVar13[2] = bVar8 | 0xc0;
          pbVar13[3] = bVar7;
          pbVar13[4] = bVar2;
          lVar6 = 3;
        }
        else {
          *pbVar13 = 6 - (cVar1 < 0x10000000);
          pbVar13[1] = (c->field_6).byte_array_stop.stop;
          bVar9 = (byte)(cVar1 >> 0x18);
          if (cVar1 < 0x10000000) {
            pbVar13[2] = bVar9 | 0xe0;
            pbVar13[3] = bVar8;
            pbVar13[4] = bVar7;
            pbVar13[5] = bVar2;
            lVar6 = 4;
          }
          else {
            pbVar13[2] = bVar9 >> 4 | 0xf0;
            pbVar13[3] = (byte)(cVar1 >> 0x14);
            pbVar13[4] = (byte)(cVar1 >> 0xc);
            pbVar13[5] = (byte)(cVar1 >> 4);
            pbVar13[6] = bVar2 & 0xf;
            lVar6 = 5;
          }
        }
      }
    }
    pbVar13 = pbVar13 + lVar6 + 2;
  }
  sVar4 = (long)pbVar13 - (long)local_48;
  puVar5 = b->data;
  uVar10 = b->alloc;
  sVar12 = b->byte;
  if (uVar10 <= sVar12 + sVar4) {
    do {
      auVar17._8_4_ = (int)(uVar10 >> 0x20);
      auVar17._0_8_ = uVar10;
      auVar17._12_4_ = 0x45300000;
      dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) * 1.5;
      uVar11 = (ulong)dVar18;
      sVar14 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      if (uVar10 == 0) {
        sVar14 = 0x400;
      }
      b->alloc = sVar14;
      puVar5 = (uchar *)realloc(puVar5,sVar14);
      b->data = puVar5;
      uVar10 = b->alloc;
      sVar12 = b->byte;
    } while (uVar10 <= sVar12 + sVar4);
  }
  memcpy(puVar5 + sVar12,local_48,sVar4);
  b->byte = b->byte + sVar4;
  return (int)sVar4 + iVar15;
}

Assistant:

int cram_byte_array_stop_encode_store(cram_codec *c, cram_block *b,
				      char *prefix, int version) {
    int len = 0;
    char buf[20], *cp = buf;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    cp += itf8_put(cp, c->codec);

    if (CRAM_MAJOR_VERS(version) == 1) {
	cp += itf8_put(cp, 5);
	*cp++ = c->e_byte_array_stop.stop;
	*cp++ = (c->e_byte_array_stop.content_id >>  0) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >>  8) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 16) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 24) & 0xff;
    } else {
	cp += itf8_put(cp, 1 + itf8_size(c->e_byte_array_stop.content_id));
	*cp++ = c->e_byte_array_stop.stop;
	cp += itf8_put(cp, c->e_byte_array_stop.content_id);
    }

    BLOCK_APPEND(b, buf, cp-buf);
    len += cp-buf;

    return len;
}